

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

TiXmlNode * __thiscall TiXmlNode::IterateChildren(TiXmlNode *this,char *val,TiXmlNode *previous)

{
  int iVar1;
  TiXmlNode *pTVar2;
  TiXmlNode **ppTVar3;
  
  if (previous != (TiXmlNode *)0x0) {
    if (previous->parent != this) {
      __assert_fail("previous->parent == this",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/luckynote[P]ibug_300W_make_landmarks_tools/src/tinyXML/tinyxml.cpp"
                    ,0x197,
                    "const TiXmlNode *TiXmlNode::IterateChildren(const char *, const TiXmlNode *) const"
                   );
    }
    pTVar2 = NextSibling(previous,val);
    return pTVar2;
  }
  ppTVar3 = &this->firstChild;
  while( true ) {
    pTVar2 = *ppTVar3;
    if (pTVar2 == (TiXmlNode *)0x0) {
      return (TiXmlNode *)0x0;
    }
    iVar1 = strcmp(((pTVar2->value).rep_)->str,val);
    if (iVar1 == 0) break;
    ppTVar3 = &pTVar2->next;
  }
  return pTVar2;
}

Assistant:

const TiXmlNode* TiXmlNode::IterateChildren( const char * val, const TiXmlNode* previous ) const
{
	if ( !previous )
	{
		return FirstChild( val );
	}
	else
	{
		assert( previous->parent == this );
		return previous->NextSibling( val );
	}
}